

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int finish_chunk(spng_ctx *ctx)

{
  uint *puVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uchar **ppuVar6;
  ulong uVar7;
  int iVar8;
  int unaff_EBP;
  uchar *data;
  uchar *data_00;
  size_t bytes;
  
  ppuVar6 = &ctx->stream_buf;
  if ((*(ushort *)&ctx->field_0xcc & 1) == 0) {
    ppuVar6 = &ctx->write_ptr;
  }
  puVar1 = (uint *)*ppuVar6;
  uVar3 = (ctx->current_chunk).length;
  *puVar1 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  puVar1[1] = *(uint *)(ctx->current_chunk).type;
  uVar3 = crc32((ctx->current_chunk).crc,puVar1 + 2,(ctx->current_chunk).length);
  (ctx->current_chunk).crc = uVar3;
  *(uint *)((long)puVar1 + (ulong)(ctx->current_chunk).length + 8) =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  if ((ctx->field_0xcc & 1) == 0) {
    uVar3 = (ctx->current_chunk).length;
    uVar2 = ctx->bytes_encoded;
    uVar7 = uVar2 + uVar3;
    ctx->bytes_encoded = uVar7;
    if (CARRY8(uVar2,(ulong)uVar3)) {
      return 3;
    }
    ctx->bytes_encoded = uVar7 + 0xc;
    if (0xfffffffffffffff3 < uVar7) {
      return 3;
    }
    ctx->write_ptr = ctx->write_ptr + (uVar3 + 0xc);
  }
  else {
    data_00 = ctx->stream_buf;
    bytes = 0;
    uVar3 = (ctx->current_chunk).length + 0xc;
    do {
      uVar5 = uVar3;
      iVar4 = unaff_EBP;
      if (uVar5 == 0) break;
      data_00 = data_00 + bytes;
      bytes = 0x2000;
      if (uVar5 < 0x2000) {
        bytes = (size_t)uVar5;
      }
      iVar4 = write_data(ctx,data_00,bytes);
      iVar8 = (int)bytes;
      if (iVar4 != 0) {
        iVar8 = 0;
      }
      uVar3 = uVar5 - iVar8;
    } while (iVar4 == 0);
    if (uVar5 != 0) {
      return iVar4;
    }
  }
  return 0;
}

Assistant:

static int finish_chunk(spng_ctx *ctx)
{
    if(ctx == NULL) return SPNG_EINTERNAL;

    struct spng_chunk *chunk = &ctx->current_chunk;

    unsigned char *header;
    unsigned char *chunk_data;

    if(ctx->streaming)
    {
        chunk_data = ctx->stream_buf + 8;
        header = ctx->stream_buf;
    }
    else
    {
        chunk_data = ctx->write_ptr + 8;
        header = ctx->write_ptr;
    }

    write_u32(header, chunk->length);
    memcpy(header + 4, chunk->type, 4);

    chunk->crc = crc32(chunk->crc, chunk_data, chunk->length);

    write_u32(chunk_data + chunk->length, chunk->crc);

    if(ctx->streaming)
    {
        const unsigned char *ptr = ctx->stream_buf;
        uint32_t bytes_left = chunk->length + 12;
        uint32_t len = 0;

        while(bytes_left)
        {
            ptr += len;
            len = SPNG_WRITE_SIZE;

            if(len > bytes_left) len = bytes_left;

            int ret = write_data(ctx, ptr, len);
            if(ret) return ret;

            bytes_left -= len;
        }
    }
    else
    {
        ctx->bytes_encoded += chunk->length;
        if(ctx->bytes_encoded < chunk->length) return SPNG_EOVERFLOW;

        ctx->bytes_encoded += 12;
        if(ctx->bytes_encoded < 12) return SPNG_EOVERFLOW;

        ctx->write_ptr += chunk->length + 12;
    }

    return 0;
}